

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O0

const_iterator __thiscall bloaty::RangeMap::FindContaining(RangeMap *this,uint64_t addr)

{
  bool bVar1;
  RangeMap *in_RSI;
  _Base_ptr in_RDI;
  const_iterator it;
  map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
  *in_stack_ffffffffffffffb8;
  byte local_31;
  _Self local_28;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter;
  _Base_ptr local_8;
  
  iter._M_node = in_RDI;
  local_8 = (_Base_ptr)
            std::
            map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
            ::upper_bound(in_stack_ffffffffffffffb8,(key_type *)0x1c53a2);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffe0,&local_28);
  local_31 = 1;
  if (!bVar1) {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
    operator--((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
               in_RDI);
    bVar1 = EntryContains<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                      (in_RSI,iter,(uint64_t)local_8);
    local_31 = bVar1 ^ 0xff;
  }
  if ((local_31 & 1) != 0) {
    local_8 = (_Base_ptr)
              std::
              map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
              ::end(in_stack_ffffffffffffffb8);
  }
  return (const_iterator)local_8;
}

Assistant:

RangeMap::Map::const_iterator RangeMap::FindContaining(uint64_t addr) const {
  auto it = mappings_.upper_bound(addr);  // Entry directly after.
  if (it == mappings_.begin() || (--it, !EntryContains(it, addr))) {
    return mappings_.end();
  } else {
    return it;
  }
}